

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

size_t __thiscall CoreML::Specification::FlattenLayerParams::ByteSizeLong(FlattenLayerParams *this)

{
  long lVar1;
  ulong uVar2;
  size_t sVar3;
  
  if ((long)this->mode_ == 0) {
    sVar3 = 0;
  }
  else {
    uVar2 = (long)this->mode_ | 1;
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar3 = (ulong)((int)lVar1 * 9 + 0x49U >> 6) + 1;
  }
  uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    sVar3 = sVar3 + *(long *)((uVar2 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar3;
  return sVar3;
}

Assistant:

inline ::CoreML::Specification::FlattenLayerParams_FlattenOrder FlattenLayerParams::_internal_mode() const {
  return static_cast< ::CoreML::Specification::FlattenLayerParams_FlattenOrder >(mode_);
}